

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

ALLEGRO_PATH * al_create_path(char *str)

{
  _Bool _Var1;
  ALLEGRO_USTR *pAVar2;
  ALLEGRO_PATH *path_00;
  long in_RDI;
  ALLEGRO_USTR *copy;
  ALLEGRO_PATH *path;
  ALLEGRO_PATH *in_stack_00000040;
  ALLEGRO_USTR *in_stack_00000048;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  ALLEGRO_PATH *local_8;
  
  local_8 = (ALLEGRO_PATH *)
            al_malloc_with_context
                      (in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                       in_stack_ffffffffffffffd8,(char *)0x17bde6);
  if (local_8 == (ALLEGRO_PATH *)0x0) {
    local_8 = (ALLEGRO_PATH *)0x0;
  }
  else {
    pAVar2 = al_ustr_new((char *)0x17be0d);
    local_8->drive = pAVar2;
    pAVar2 = al_ustr_new((char *)0x17be24);
    local_8->filename = pAVar2;
    _al_vector_init(&local_8->segments,8);
    pAVar2 = al_ustr_new((char *)0x17be4f);
    local_8->basename = pAVar2;
    pAVar2 = al_ustr_new((char *)0x17be67);
    local_8->full_string = pAVar2;
    if (in_RDI != 0) {
      path_00 = (ALLEGRO_PATH *)al_ustr_new((char *)0x17be85);
      replace_backslashes((ALLEGRO_USTR *)0x17be94);
      _Var1 = parse_path_string(in_stack_00000048,in_stack_00000040);
      if (!_Var1) {
        al_destroy_path(path_00);
        local_8 = (ALLEGRO_PATH *)0x0;
      }
      al_ustr_free((ALLEGRO_USTR *)0x17bec4);
    }
  }
  return local_8;
}

Assistant:

ALLEGRO_PATH *al_create_path(const char *str)
{
   ALLEGRO_PATH *path;

   path = al_malloc(sizeof(ALLEGRO_PATH));
   if (!path)
      return NULL;

   path->drive = al_ustr_new("");
   path->filename = al_ustr_new("");
   _al_vector_init(&path->segments, sizeof(ALLEGRO_USTR *));
   path->basename = al_ustr_new("");
   path->full_string = al_ustr_new("");

   if (str != NULL) {
      ALLEGRO_USTR *copy = al_ustr_new(str);
      replace_backslashes(copy);

      if (!parse_path_string(copy, path)) {
         al_destroy_path(path);
         path = NULL;
      }

      al_ustr_free(copy);
   }

   return path;
}